

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField(ExtensionSet *this,int number)

{
  Extension *pEVar1;
  LogMessage *pLVar2;
  LogFinisher local_49;
  LogMessage local_48;
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_FATAL,
               "third_party/sentencepiece/third_party/protobuf-lite/extension_set.cc",0x1b3);
    pLVar2 = LogMessage::operator<<(&local_48,"CHECK failed: extension != NULL: ");
    pLVar2 = LogMessage::operator<<(pLVar2,"Extension not found.");
    LogFinisher::operator=(&local_49,pLVar2);
    LogMessage::~LogMessage(&local_48);
  }
  return (void *)(pEVar1->field_0).int64_value;
}

Assistant:

void* ExtensionSet::MutableRawRepeatedField(int number) {
  Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != NULL) << "Extension not found.";
  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  return extension->repeated_int32_value;
}